

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
TldAddressAsKey::TldAddressAsKey
          (TldAddressAsKey *this,uint8_t *addr,size_t addr_len,uint8_t *tld,size_t tld_len,
          my_bpftimeval ts,int is_nx,DnsStatsLeakType leakType,int flags)

{
  size_t __n;
  
  this->HashNext = (TldAddressAsKey *)0x0;
  this->count = 1;
  this->hash = 0;
  this->tld_min_delay = -1;
  this->is_nx = is_nx;
  this->leakType = leakType;
  this->flags = flags;
  __n = 0x10;
  if (addr_len < 0x10) {
    __n = addr_len;
  }
  memcpy(this->addr,addr,__n);
  this->addr_len = __n;
  (this->ts).tv_sec = ts.tv_sec;
  (this->ts).tv_usec = ts.tv_usec;
  (this->ts_init).tv_sec = ts.tv_sec;
  (this->ts_init).tv_usec = ts.tv_usec;
  TldAsKey::CanonicCopy(this->tld,0x40,&this->tld_len,tld,tld_len);
  return;
}

Assistant:

TldAddressAsKey::TldAddressAsKey(uint8_t * addr, size_t addr_len, uint8_t * tld, size_t tld_len, my_bpftimeval ts, int is_nx, DnsStatsLeakType leakType, int flags)
    :
    HashNext(NULL),
    count(1),
    hash(0),
    tld_min_delay(-1),
    is_nx(is_nx),
    leakType(leakType),
    flags(flags)
{
    if (addr_len > 16)
    {
        addr_len = 16;
    }

    memcpy(this->addr, addr, addr_len);
    this->addr_len = addr_len;

    this->ts.tv_sec = ts.tv_sec;
    this->ts.tv_usec = ts.tv_usec;

    this->ts_init.tv_sec = ts.tv_sec;
    this->ts_init.tv_usec = ts.tv_usec;

    TldAsKey::CanonicCopy(this->tld, sizeof(this->tld) - 1, &this->tld_len, tld, tld_len);
}